

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBufSize.c
# Opt level: O1

void Bus_ManStop(Bus_Man_t *p)

{
  void **__ptr;
  float *pfVar1;
  
  if (p->vFanouts != (Vec_Ptr_t *)0x0) {
    __ptr = p->vFanouts->pArray;
    if (__ptr != (void **)0x0) {
      free(__ptr);
      p->vFanouts->pArray = (void **)0x0;
    }
    if (p->vFanouts != (Vec_Ptr_t *)0x0) {
      free(p->vFanouts);
      p->vFanouts = (Vec_Ptr_t *)0x0;
    }
  }
  if (p->vWireCaps != (Vec_Flt_t *)0x0) {
    pfVar1 = p->vWireCaps->pArray;
    if (pfVar1 != (float *)0x0) {
      free(pfVar1);
      p->vWireCaps->pArray = (float *)0x0;
    }
    if (p->vWireCaps != (Vec_Flt_t *)0x0) {
      free(p->vWireCaps);
      p->vWireCaps = (Vec_Flt_t *)0x0;
    }
  }
  if (p->vCins != (Vec_Flt_t *)0x0) {
    pfVar1 = p->vCins->pArray;
    if (pfVar1 != (float *)0x0) {
      free(pfVar1);
      p->vCins->pArray = (float *)0x0;
    }
    if (p->vCins != (Vec_Flt_t *)0x0) {
      free(p->vCins);
      p->vCins = (Vec_Flt_t *)0x0;
    }
  }
  if (p->vETimes != (Vec_Flt_t *)0x0) {
    pfVar1 = p->vETimes->pArray;
    if (pfVar1 != (float *)0x0) {
      free(pfVar1);
      p->vETimes->pArray = (float *)0x0;
    }
    if (p->vETimes != (Vec_Flt_t *)0x0) {
      free(p->vETimes);
      p->vETimes = (Vec_Flt_t *)0x0;
    }
  }
  if (p->vLoads != (Vec_Flt_t *)0x0) {
    pfVar1 = p->vLoads->pArray;
    if (pfVar1 != (float *)0x0) {
      free(pfVar1);
      p->vLoads->pArray = (float *)0x0;
    }
    if (p->vLoads != (Vec_Flt_t *)0x0) {
      free(p->vLoads);
      p->vLoads = (Vec_Flt_t *)0x0;
    }
  }
  if (p->vDepts != (Vec_Flt_t *)0x0) {
    pfVar1 = p->vDepts->pArray;
    if (pfVar1 != (float *)0x0) {
      free(pfVar1);
      p->vDepts->pArray = (float *)0x0;
    }
    if (p->vDepts != (Vec_Flt_t *)0x0) {
      free(p->vDepts);
      p->vDepts = (Vec_Flt_t *)0x0;
    }
  }
  if (p != (Bus_Man_t *)0x0) {
    free(p);
    return;
  }
  return;
}

Assistant:

void Bus_ManStop( Bus_Man_t * p )
{
    Vec_PtrFreeP( &p->vFanouts );
    Vec_FltFreeP( &p->vWireCaps );
    Vec_FltFreeP( &p->vCins );
    Vec_FltFreeP( &p->vETimes );
    Vec_FltFreeP( &p->vLoads );
    Vec_FltFreeP( &p->vDepts );
    ABC_FREE( p );
}